

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.hpp
# Opt level: O2

void __thiscall beast::unit_test::runner::log<void>(runner *this,string *s)

{
  allocator local_39;
  string local_38;
  
  ::std::recursive_mutex::lock((recursive_mutex *)&this->mutex_);
  if (this->default_ == true) {
    ::std::__cxx11::string::string((string *)&local_38,"",&local_39);
    testcase<void>(this,&local_38);
    ::std::__cxx11::string::~string((string *)&local_38);
  }
  (*this->_vptr_runner[8])(this,s);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mutex_);
  return;
}

Assistant:

void
runner::log(std::string const& s)
{
    std::lock_guard<std::recursive_mutex> lock(mutex_);
    if(default_)
        testcase("");
    on_log(s);
}